

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_SetArraySegmentVars
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  uint offset;
  FunctionBody *functionBody;
  AuxArray<void_*> *vars_00;
  SparseArraySegment<void_*> *segment_00;
  SparseArraySegment<void_*> *segment;
  VarArray *vars;
  OpLayoutAuxiliary *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxNoReg).Offset;
  functionBody = GetFunctionBody(this);
  vars_00 = ByteCodeReader::ReadAuxArray<void*>(offset,functionBody);
  segment_00 = (SparseArraySegment<void_*> *)GetNonVarReg(this,playout->R0);
  Js::JavascriptOperators::AddVarsToArraySegment(segment_00,vars_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArraySegmentVars(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::VarArray *vars = Js::ByteCodeReader::ReadAuxArray<Var>(playout->Offset, this->GetFunctionBody());

        SparseArraySegment<Var> * segment = (SparseArraySegment<Var> *)GetNonVarReg(playout->R0);

        JavascriptOperators::AddVarsToArraySegment(segment, vars);
    }